

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_flip_h_no_crop(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                      jvirt_barray_ptr *src_coef_arrays)

{
  undefined2 uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  JBLOCKROW output_row;
  long lVar6;
  long in_RCX;
  int in_EDX;
  short *psVar7;
  short *psVar8;
  long in_RSI;
  long in_RDI;
  jpeg_component_info *compptr;
  JCOEF temp2;
  JCOEF temp1;
  JCOEFPTR ptr2;
  JCOEFPTR ptr1;
  JBLOCKARRAY buffer;
  int offset_y;
  int k;
  int ci;
  JDIMENSION x_crop_blocks;
  JDIMENSION blk_y;
  JDIMENSION blk_x;
  JDIMENSION comp_width;
  JDIMENSION MCU_cols;
  undefined4 in_stack_ffffffffffffffa0;
  short in_stack_ffffffffffffffa4;
  short in_stack_ffffffffffffffa6;
  undefined2 *local_58;
  undefined2 *local_50;
  int local_40;
  int local_3c;
  int local_38;
  uint local_30;
  uint local_2c;
  
  uVar2 = *(uint *)(in_RDI + 0x88);
  iVar3 = *(int *)(in_RSI + 0x138);
  for (local_38 = 0; local_38 < *(int *)(in_RSI + 0x4c); local_38 = local_38 + 1) {
    output_row = (JBLOCKROW)(*(long *)(in_RSI + 0x58) + (long)local_38 * 0x60);
    uVar5 = (uVar2 / (uint)(iVar3 << 3)) * *(int *)(*output_row + 4);
    iVar4 = *(int *)(*output_row + 4);
    for (local_30 = 0; local_30 < *(uint *)(*output_row + 0x10);
        local_30 = *(int *)(*output_row + 6) + local_30) {
      lVar6 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_RCX + (long)local_38 * 8),local_30,
                         *(undefined4 *)(*output_row + 6),1);
      for (local_40 = 0; local_40 < *(int *)(*output_row + 6); local_40 = local_40 + 1) {
        for (local_2c = 0; local_2c << 1 < uVar5; local_2c = local_2c + 1) {
          local_50 = (undefined2 *)(*(long *)(lVar6 + (long)local_40 * 8) + (ulong)local_2c * 0x80);
          local_58 = (undefined2 *)
                     (*(long *)(lVar6 + (long)local_40 * 8) + (ulong)((uVar5 - local_2c) - 1) * 0x80
                     );
          for (local_3c = 0; local_3c < 0x40; local_3c = local_3c + 2) {
            uVar1 = *local_50;
            psVar7 = local_50 + 1;
            *local_50 = *local_58;
            psVar8 = local_58 + 1;
            *local_58 = uVar1;
            in_stack_ffffffffffffffa6 = *psVar7;
            in_stack_ffffffffffffffa4 = *psVar8;
            local_50 = local_50 + 2;
            *psVar7 = -in_stack_ffffffffffffffa4;
            local_58 = local_58 + 2;
            *psVar8 = -in_stack_ffffffffffffffa6;
          }
        }
        if (in_EDX * iVar4 != 0) {
          for (local_2c = 0; local_2c < *(uint *)(*output_row + 0xe); local_2c = local_2c + 1) {
            jcopy_block_row((JBLOCKROW)
                            CONCAT26(in_stack_ffffffffffffffa6,
                                     CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
                            output_row,0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
do_flip_h_no_crop(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                  JDIMENSION x_crop_offset, jvirt_barray_ptr *src_coef_arrays)
/* Horizontal flip; done in-place, so no separate dest array is required.
 * NB: this only works when y_crop_offset is zero.
 */
{
  JDIMENSION MCU_cols, comp_width, blk_x, blk_y, x_crop_blocks;
  int ci, k, offset_y;
  JBLOCKARRAY buffer;
  JCOEFPTR ptr1, ptr2;
  JCOEF temp1, temp2;
  jpeg_component_info *compptr;

  /* Horizontal mirroring of DCT blocks is accomplished by swapping
   * pairs of blocks in-place.  Within a DCT block, we perform horizontal
   * mirroring by changing the signs of odd-numbered columns.
   * Partial iMCUs at the right edge are left untouched.
   */
  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    for (blk_y = 0; blk_y < compptr->height_in_blocks;
         blk_y += compptr->v_samp_factor) {
      buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        /* Do the mirroring */
        for (blk_x = 0; blk_x * 2 < comp_width; blk_x++) {
          ptr1 = buffer[offset_y][blk_x];
          ptr2 = buffer[offset_y][comp_width - blk_x - 1];
          /* this unrolled loop doesn't need to know which row it's on... */
          for (k = 0; k < DCTSIZE2; k += 2) {
            temp1 = *ptr1;      /* swap even column */
            temp2 = *ptr2;
            *ptr1++ = temp2;
            *ptr2++ = temp1;
            temp1 = *ptr1;      /* swap odd column with sign change */
            temp2 = *ptr2;
            *ptr1++ = -temp2;
            *ptr2++ = -temp1;
          }
        }
        if (x_crop_blocks > 0) {
          /* Now left-justify the portion of the data to be kept.
           * We can't use a single jcopy_block_row() call because that routine
           * depends on memcpy(), whose behavior is unspecified for overlapping
           * source and destination areas.  Sigh.
           */
          for (blk_x = 0; blk_x < compptr->width_in_blocks; blk_x++) {
            jcopy_block_row(buffer[offset_y] + blk_x + x_crop_blocks,
                            buffer[offset_y] + blk_x, (JDIMENSION)1);
          }
        }
      }
    }
  }
}